

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined2 *puVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong *puVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong *puVar17;
  ulong uVar18;
  bool bVar19;
  ulong *local_40;
  
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar11 = 0;
      uVar7 = 0;
      puVar12 = (ulong *)0x0;
      cSrc = (ulong *)0x0;
      puVar17 = (ulong *)0x0;
    }
    else {
      puVar17 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar7 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar7 = uVar7 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar9 = (uint)bVar5;
          if (bVar5 == 0) {
            cSrcSize = 0xffffffffffffffec;
          }
          else {
            uVar9 = (LZCOUNT((uint)bVar5) ^ 0xffffffe0U) + (int)cSrcSize * -8 + 0x49;
          }
          uVar11 = (ulong)uVar9;
          puVar12 = (ulong *)cSrc;
        }
      }
      else {
        puVar12 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar7 = *puVar12;
        bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar9 = (LZCOUNT((uint)bVar5) ^ 0xffffffe0U) + 9;
        if (bVar5 == 0) {
          uVar9 = (uint)bVar5;
        }
        uVar11 = (ulong)uVar9;
        cSrcSize = cSrcSize | -(ulong)(bVar5 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    puVar1 = (undefined2 *)((long)dst + dstSize);
    uVar9 = *DTable;
    iVar6 = (int)cSrc;
    if (7 < dstSize) {
      uVar10 = -(uVar9 >> 0x10) & 0x3f;
      if (0xbffff < (uVar9 & 0xfc0000)) {
        do {
          uVar16 = (uint)uVar11;
          if (uVar16 < 0x41) {
            if (puVar12 < puVar17) {
              if (puVar12 == (ulong *)cSrc) goto LAB_001c147f;
              bVar19 = cSrc <= (ulong *)((long)puVar12 - (uVar11 >> 3));
              uVar14 = (int)puVar12 - iVar6;
              if (bVar19) {
                uVar14 = (uint)(uVar11 >> 3);
              }
              uVar16 = uVar16 + uVar14 * -8;
            }
            else {
              uVar14 = (uint)(uVar11 >> 3);
              uVar16 = uVar16 & 7;
              bVar19 = true;
            }
            uVar11 = (ulong)uVar16;
            puVar12 = (ulong *)((long)puVar12 - (ulong)uVar14);
            uVar7 = *puVar12;
          }
          else {
LAB_001c147f:
            bVar19 = false;
          }
          if (((undefined2 *)((long)puVar1 - 7U) <= dst) || (!bVar19)) goto LAB_001c159c;
          uVar8 = (uVar7 << (uVar11 & 0x3f)) >> uVar10;
          *(short *)dst = (short)DTable[uVar8 + 1];
          uVar16 = (uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar11;
          uVar11 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          uVar8 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
          *(short *)((long)dst + uVar11) = (short)DTable[uVar8 + 1];
          uVar16 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar16;
          uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          lVar3 = uVar8 + uVar11;
          uVar15 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
          *(short *)((long)dst + uVar8 + uVar11) = (short)DTable[uVar15 + 1];
          uVar16 = *(byte *)((long)DTable + uVar15 * 4 + 6) + uVar16;
          uVar15 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
          uVar8 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
          *(short *)((long)dst + uVar15 + lVar3) = (short)DTable[uVar8 + 1];
          uVar11 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar16);
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + uVar15 + lVar3
                        );
        } while( true );
      }
      do {
        uVar16 = (uint)uVar11;
        if (uVar16 < 0x41) {
          if (puVar12 < puVar17) {
            if (puVar12 == (ulong *)cSrc) goto LAB_001c1305;
            bVar19 = cSrc <= (ulong *)((long)puVar12 - (uVar11 >> 3));
            uVar14 = (int)puVar12 - iVar6;
            if (bVar19) {
              uVar14 = (uint)(uVar11 >> 3);
            }
            uVar16 = uVar16 + uVar14 * -8;
          }
          else {
            uVar14 = (uint)(uVar11 >> 3);
            uVar16 = uVar16 & 7;
            bVar19 = true;
          }
          uVar11 = (ulong)uVar16;
          puVar12 = (ulong *)((long)puVar12 - (ulong)uVar14);
          uVar7 = *puVar12;
        }
        else {
LAB_001c1305:
          bVar19 = false;
        }
        if (((undefined2 *)((long)puVar1 - 9U) <= dst) || (!bVar19)) goto LAB_001c159c;
        uVar8 = (uVar7 << (uVar11 & 0x3f)) >> uVar10;
        *(short *)dst = (short)DTable[uVar8 + 1];
        uVar16 = (uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar11;
        uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        uVar11 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
        *(short *)((long)dst + uVar8) = (short)DTable[uVar11 + 1];
        uVar16 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar16;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        lVar3 = uVar11 + uVar8;
        uVar15 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
        *(short *)((long)dst + uVar11 + uVar8) = (short)DTable[uVar15 + 1];
        uVar16 = *(byte *)((long)DTable + uVar15 * 4 + 6) + uVar16;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
        lVar4 = uVar11 + lVar3;
        uVar8 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
        *(short *)((long)dst + uVar11 + lVar3) = (short)DTable[uVar8 + 1];
        uVar16 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar16;
        uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        uVar15 = (uVar7 << ((ulong)uVar16 & 0x3f)) >> uVar10;
        *(short *)((long)dst + uVar8 + lVar4) = (short)DTable[uVar15 + 1];
        uVar11 = (ulong)(*(byte *)((long)DTable + uVar15 * 4 + 6) + uVar16);
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7) + uVar8 + lVar4);
      } while( true );
    }
    uVar10 = (uint)uVar11;
    if (uVar10 < 0x41) {
      if (puVar12 < puVar17) {
        if (puVar12 == (ulong *)cSrc) goto LAB_001c159c;
        uVar16 = (int)puVar12 - iVar6;
        if (cSrc <= (ulong *)((long)puVar12 - (uVar11 >> 3))) {
          uVar16 = (uint)(uVar11 >> 3);
        }
        uVar10 = uVar10 + uVar16 * -8;
      }
      else {
        uVar16 = (uint)(uVar11 >> 3);
        uVar10 = uVar10 & 7;
      }
      uVar11 = (ulong)uVar10;
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar16);
      uVar7 = *puVar12;
    }
LAB_001c159c:
    if (1 < (ulong)((long)puVar1 - (long)dst)) {
      uVar10 = -(uVar9 >> 0x10) & 0x3f;
      do {
        uVar16 = (uint)uVar11;
        if (uVar16 < 0x41) {
          if (puVar12 < puVar17) {
            if (puVar12 == (ulong *)cSrc) goto LAB_001c15c3;
            bVar19 = cSrc <= (ulong *)((long)puVar12 - (uVar11 >> 3));
            uVar14 = (int)puVar12 - iVar6;
            if (bVar19) {
              uVar14 = (uint)(uVar11 >> 3);
            }
            uVar16 = uVar16 + uVar14 * -8;
          }
          else {
            uVar14 = (uint)(uVar11 >> 3);
            uVar16 = uVar16 & 7;
            bVar19 = true;
          }
          uVar11 = (ulong)uVar16;
          puVar12 = (ulong *)((long)puVar12 - (ulong)uVar14);
          uVar7 = *puVar12;
        }
        else {
LAB_001c15c3:
          bVar19 = false;
        }
        if ((puVar1 + -1 < dst) || (!bVar19)) goto LAB_001c1675;
        uVar8 = (uVar7 << (uVar11 & 0x3f)) >> uVar10;
        *(short *)dst = (short)DTable[uVar8 + 1];
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7));
        uVar11 = (ulong)((uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar11);
      } while( true );
    }
LAB_001c167d:
    uVar10 = (uint)uVar11;
    if (dst < puVar1) {
      uVar7 = (uVar7 << (uVar11 & 0x3f)) >> ((ulong)(byte)-(char)(uVar9 >> 0x10) & 0x3f);
      *(char *)dst = (char)DTable[uVar7 + 1];
      if (*(char *)((long)DTable + uVar7 * 4 + 7) == '\x01') {
        uVar10 = uVar10 + *(byte *)((long)DTable + uVar7 * 4 + 6);
      }
      else if (uVar10 < 0x40) {
        uVar9 = uVar10 + *(byte *)((long)DTable + uVar7 * 4 + 6);
        uVar10 = 0x40;
        if (uVar9 < 0x40) {
          uVar10 = uVar9;
        }
      }
    }
    if (uVar10 != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    if (puVar12 != (ulong *)cSrc) {
      dstSize = 0xffffffffffffffec;
    }
    return dstSize;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar11 = 0;
    uVar7 = 0;
    puVar17 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    local_40 = (ulong *)0x0;
  }
  else {
    local_40 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar7 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar7 = uVar7 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar9 = 0x1f;
        if (bVar5 != 0) {
          for (; bVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        if (bVar5 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar9 = 0;
        }
        else {
          uVar9 = ~uVar9 + (int)cSrcSize * -8 + 0x49;
        }
        uVar11 = (ulong)uVar9;
        puVar17 = (ulong *)cSrc;
      }
    }
    else {
      puVar17 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar7 = *puVar17;
      bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar9 = 0x1f;
      if (bVar5 != 0) {
        for (; bVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = ~uVar9 + 9;
      if (bVar5 == 0) {
        uVar9 = 0;
      }
      uVar11 = (ulong)uVar9;
      cSrcSize = cSrcSize | -(ulong)(bVar5 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  iVar6 = (int)cSrc;
  cVar2 = (char)(*DTable >> 0x10);
  if (7 < dstSize) {
    bVar5 = -cVar2 & 0x3f;
    if (0xbffff < (*DTable & 0xfc0000)) {
      do {
        uVar9 = (uint)uVar11;
        if (uVar9 < 0x41) {
          if (puVar17 < local_40) {
            if (puVar17 == (ulong *)cSrc) goto LAB_0017a6c0;
            bVar19 = cSrc <= (ulong *)((long)puVar17 - (uVar11 >> 3));
            uVar10 = (int)puVar17 - iVar6;
            if (bVar19) {
              uVar10 = (uint)(uVar11 >> 3);
            }
            uVar9 = uVar9 + uVar10 * -8;
          }
          else {
            uVar10 = (uint)(uVar11 >> 3);
            uVar9 = uVar9 & 7;
            bVar19 = true;
          }
          uVar11 = (ulong)uVar9;
          puVar17 = (ulong *)((long)puVar17 - (ulong)uVar10);
          uVar7 = *puVar17;
        }
        else {
LAB_0017a6c0:
          bVar19 = false;
        }
        if (((undefined2 *)((long)puVar1 - 7U) <= dst) || (!bVar19)) goto LAB_0017a7ef;
        uVar8 = (uVar7 << ((byte)uVar11 & 0x3f)) >> bVar5;
        *(short *)dst = (short)DTable[uVar8 + 1];
        iVar13 = (uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar11;
        uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        uVar11 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
        *(short *)((long)dst + uVar8) = (short)DTable[uVar11 + 1];
        iVar13 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar13;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        lVar3 = uVar11 + uVar8;
        uVar18 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
        *(short *)((long)dst + uVar11 + uVar8) = (short)DTable[uVar18 + 1];
        iVar13 = (uint)*(byte *)((long)DTable + uVar18 * 4 + 6) + iVar13;
        uVar15 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
        uVar8 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        *(short *)((long)dst + uVar8 + lVar3) = (short)DTable[uVar15 + 1];
        uVar11 = (ulong)((uint)*(byte *)((long)DTable + uVar15 * 4 + 6) + iVar13);
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7) + uVar8 + lVar3);
      } while( true );
    }
    do {
      uVar9 = (uint)uVar11;
      if (uVar9 < 0x41) {
        if (puVar17 < local_40) {
          if (puVar17 == (ulong *)cSrc) goto LAB_0017a52c;
          bVar19 = cSrc <= (ulong *)((long)puVar17 - (uVar11 >> 3));
          uVar10 = (int)puVar17 - iVar6;
          if (bVar19) {
            uVar10 = (uint)(uVar11 >> 3);
          }
          uVar9 = uVar9 + uVar10 * -8;
        }
        else {
          uVar10 = (uint)(uVar11 >> 3);
          uVar9 = uVar9 & 7;
          bVar19 = true;
        }
        uVar11 = (ulong)uVar9;
        puVar17 = (ulong *)((long)puVar17 - (ulong)uVar10);
        uVar7 = *puVar17;
      }
      else {
LAB_0017a52c:
        bVar19 = false;
      }
      if (((undefined2 *)((long)puVar1 - 9U) <= dst) || (!bVar19)) goto LAB_0017a7ef;
      uVar8 = (uVar7 << ((byte)uVar11 & 0x3f)) >> bVar5;
      *(short *)dst = (short)DTable[uVar8 + 1];
      iVar13 = (uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar11;
      uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
      uVar11 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
      *(short *)((long)dst + uVar8) = (short)DTable[uVar11 + 1];
      iVar13 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar13;
      uVar15 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
      lVar3 = uVar15 + uVar8;
      uVar11 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
      *(short *)((long)dst + uVar15 + uVar8) = (short)DTable[uVar11 + 1];
      iVar13 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar13;
      uVar8 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
      lVar4 = uVar8 + lVar3;
      uVar11 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
      *(short *)((long)dst + uVar8 + lVar3) = (short)DTable[uVar11 + 1];
      iVar13 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar13;
      uVar15 = (uVar7 << ((byte)iVar13 & 0x3f)) >> bVar5;
      uVar8 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
      *(short *)((long)dst + uVar8 + lVar4) = (short)DTable[uVar15 + 1];
      uVar11 = (ulong)((uint)*(byte *)((long)DTable + uVar15 * 4 + 6) + iVar13);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7) + uVar8 + lVar4);
    } while( true );
  }
  uVar9 = (uint)uVar11;
  if (uVar9 < 0x41) {
    if (puVar17 < local_40) {
      if (puVar17 == (ulong *)cSrc) goto LAB_0017a7ef;
      uVar10 = (int)puVar17 - iVar6;
      if (cSrc <= (ulong *)((long)puVar17 - (uVar11 >> 3))) {
        uVar10 = (uint)(uVar11 >> 3);
      }
      uVar9 = uVar9 + uVar10 * -8;
    }
    else {
      uVar10 = (uint)(uVar11 >> 3);
      uVar9 = uVar9 & 7;
    }
    uVar11 = (ulong)uVar9;
    puVar17 = (ulong *)((long)puVar17 - (ulong)uVar10);
    uVar7 = *puVar17;
  }
LAB_0017a7ef:
  uVar9 = (uint)uVar11;
  if (1 < (ulong)((long)puVar1 - (long)dst)) {
    do {
      uVar9 = (uint)uVar11;
      if (uVar9 < 0x41) {
        if (puVar17 < local_40) {
          if (puVar17 == (ulong *)cSrc) goto LAB_0017a81a;
          bVar19 = cSrc <= (ulong *)((long)puVar17 - (uVar11 >> 3));
          uVar10 = (int)puVar17 - iVar6;
          if (bVar19) {
            uVar10 = (uint)(uVar11 >> 3);
          }
          uVar9 = uVar9 + uVar10 * -8;
        }
        else {
          uVar10 = (uint)(uVar11 >> 3);
          uVar9 = uVar9 & 7;
          bVar19 = true;
        }
        uVar11 = (ulong)uVar9;
        puVar17 = (ulong *)((long)puVar17 - (ulong)uVar10);
        uVar7 = *puVar17;
      }
      else {
LAB_0017a81a:
        bVar19 = false;
      }
      if ((puVar1 + -1 < dst) || (!bVar19)) goto LAB_0017a8d1;
      uVar8 = (uVar7 << ((byte)uVar11 & 0x3f)) >> (-cVar2 & 0x3fU);
      *(short *)dst = (short)DTable[uVar8 + 1];
      uVar11 = (ulong)((int)uVar11 + (uint)*(byte *)((long)DTable + uVar8 * 4 + 6));
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7));
    } while( true );
  }
LAB_0017a8dc:
  if (dst < puVar1) {
    uVar7 = (uVar7 << ((byte)uVar9 & 0x3f)) >> (-cVar2 & 0x3fU);
    *(char *)dst = (char)DTable[uVar7 + 1];
    if (*(char *)((long)DTable + uVar7 * 4 + 7) == '\x01') {
      uVar9 = uVar9 + *(byte *)((long)DTable + uVar7 * 4 + 6);
    }
    else if (uVar9 < 0x40) {
      uVar10 = uVar9 + *(byte *)((long)DTable + uVar7 * 4 + 6);
      uVar9 = 0x40;
      if (uVar10 < 0x40) {
        uVar9 = uVar10;
      }
    }
  }
  if (uVar9 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar17 != (ulong *)cSrc) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
LAB_001c1675:
  for (; dst <= puVar1 + -1;
      dst = (void *)((ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + (long)dst)) {
    uVar8 = (uVar7 << (uVar11 & 0x3f)) >> uVar10;
    *(short *)dst = (short)DTable[uVar8 + 1];
    uVar11 = (ulong)((uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar11);
  }
  goto LAB_001c167d;
LAB_0017a8d1:
  for (; uVar9 = (uint)uVar11, dst <= puVar1 + -1;
      dst = (void *)((ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + (long)dst)) {
    uVar8 = (uVar7 << ((byte)uVar11 & 0x3f)) >> (-cVar2 & 0x3fU);
    *(short *)dst = (short)DTable[uVar8 + 1];
    uVar11 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar9);
  }
  goto LAB_0017a8dc;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}